

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O3

stbtt__buf stbtt__cff_index_get(stbtt__buf b,int i)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uchar *puVar7;
  uchar *puVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  stbtt__buf sVar15;
  
  puVar7 = b.data;
  if (b._8_8_ < 0) {
LAB_001d0f7a:
    __assert_fail("!(o > b->size || o < 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                  ,0x46c,"void stbtt__buf_seek(stbtt__buf *, int)");
  }
  iVar9 = 0;
  iVar3 = 2;
  uVar1 = 0;
  do {
    uVar6 = b.size;
    if (iVar9 < (int)uVar6) {
      lVar13 = (long)iVar9;
      iVar9 = iVar9 + 1;
      uVar4 = (uint)puVar7[lVar13];
    }
    else {
      uVar4 = 0;
    }
    uVar1 = uVar1 << 8 | uVar4;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  if (iVar9 < (int)uVar6) {
    lVar13 = (long)iVar9;
    iVar9 = iVar9 + 1;
    bVar2 = puVar7[lVar13];
  }
  else {
    bVar2 = 0;
  }
  if ((i < 0) || ((int)uVar1 <= i)) {
    __assert_fail("i >= 0 && i < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                  ,0x4e1,"stbtt__buf stbtt__cff_index_get(stbtt__buf, int)");
  }
  if (3 < (byte)(bVar2 - 1)) {
    __assert_fail("offsize >= 1 && offsize <= 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                  ,0x4e2,"stbtt__buf stbtt__cff_index_get(stbtt__buf, int)");
  }
  uVar4 = (uint)bVar2;
  uVar5 = i * uVar4 + iVar9;
  if (uVar6 < uVar5) goto LAB_001d0f7a;
  uVar10 = 0;
  uVar11 = uVar4;
  do {
    if ((int)uVar5 < (int)uVar6) {
      lVar13 = (long)(int)uVar5;
      uVar5 = uVar5 + 1;
      uVar12 = (uint)puVar7[lVar13];
    }
    else {
      uVar12 = 0;
    }
    uVar10 = uVar10 << 8 | uVar12;
    uVar11 = uVar11 - 1;
  } while (uVar11 != 0);
  uVar12 = 0;
  uVar11 = uVar4;
  do {
    if ((int)uVar5 < (int)uVar6) {
      lVar13 = (long)(int)uVar5;
      uVar5 = uVar5 + 1;
      uVar14 = (uint)puVar7[lVar13];
    }
    else {
      uVar14 = 0;
    }
    uVar12 = uVar12 << 8 | uVar14;
    uVar11 = uVar11 - 1;
  } while (uVar11 != 0);
  uVar1 = (uVar1 + 1) * uVar4 + uVar10 + 2;
  uVar12 = uVar12 - uVar10;
  if (-1 < (int)(uVar12 | uVar1)) {
    puVar8 = (uchar *)0x0;
    if ((int)uVar1 <= (int)uVar6) {
      lVar13 = 0;
      if ((int)uVar12 <= (int)(uVar6 - uVar1)) {
        puVar8 = puVar7 + uVar1;
        lVar13 = (ulong)uVar12 << 0x20;
      }
      goto LAB_001d0f78;
    }
  }
  puVar8 = (uchar *)0x0;
  lVar13 = 0;
LAB_001d0f78:
  sVar15.cursor = (int)lVar13;
  sVar15.size = (int)((ulong)lVar13 >> 0x20);
  sVar15.data = puVar8;
  return sVar15;
}

Assistant:

static stbtt__buf stbtt__cff_index_get(stbtt__buf b, int i)
{
   int count, offsize, start, end;
   stbtt__buf_seek(&b, 0);
   count = stbtt__buf_get16(&b);
   offsize = stbtt__buf_get8(&b);
   STBTT_assert(i >= 0 && i < count);
   STBTT_assert(offsize >= 1 && offsize <= 4);
   stbtt__buf_skip(&b, i*offsize);
   start = stbtt__buf_get(&b, offsize);
   end = stbtt__buf_get(&b, offsize);
   return stbtt__buf_range(&b, 2+(count+1)*offsize+start, end - start);
}